

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfgconv.cpp
# Opt level: O3

bool isAddrInRange(Addr addr)

{
  bool bVar1;
  _List_node_base *p_Var2;
  
  bVar1 = true;
  p_Var2 = config.ranges.
           super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (config.ranges.
      super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl._M_node._M_size != 0) {
    for (; p_Var2 != (_List_node_base *)&config.ranges; p_Var2 = p_Var2->_M_next) {
      if ((p_Var2[1]._M_next <= addr) && (addr <= p_Var2[1]._M_prev)) {
        return true;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool isAddrInRange(Addr addr) {
	// if the range list is empty, consider the address in range.
	if (config.ranges.size() == 0)
		return true;

	for (std::list<std::pair<Addr, Addr> >::const_iterator it =  config.ranges.cbegin(),
			ed = config.ranges.cend(); it != ed; it++) {
		if (addr >= it->first && addr <= it->second)
			return true;
	}

	return false;
}